

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::call_match
          (Dynamic_Object_Constructor *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *vals,
          Type_Conversions_State *t_conversions)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  byte bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 in_RDX;
  long in_RDI;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_vals;
  string *in_stack_fffffffffffffe88;
  Dynamic_Object *in_stack_fffffffffffffe90;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  pointer *this_00;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  __last;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  __first;
  const_iterator __position;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 t_return_value;
  Dynamic_Object *in_stack_ffffffffffffff08;
  Boxed_Value *in_stack_ffffffffffffff10;
  undefined1 local_de [134];
  undefined1 *local_58;
  undefined1 local_50 [24];
  undefined8 local_38;
  undefined1 local_30 [24];
  undefined8 local_18;
  
  t_return_value = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  local_de[1] = 1;
  local_58 = local_50;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(local_de + 0xe),(string *)(in_RDI + 0x28));
  Dynamic_Object::Dynamic_Object(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(bool)t_return_value);
  local_de[1] = 0;
  local_50._16_8_ = local_50;
  local_38 = 1;
  __position._M_current = (Boxed_Value *)local_de;
  std::allocator<chaiscript::Boxed_Value>::allocator((allocator<chaiscript::Boxed_Value> *)0x261f0d)
  ;
  __l._M_len = in_stack_fffffffffffffed0;
  __l._M_array = in_stack_fffffffffffffec8;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (in_stack_fffffffffffffec0,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::allocator<chaiscript::Boxed_Value>::~allocator
            ((allocator<chaiscript::Boxed_Value> *)0x261f3e);
  __last._M_current = (Boxed_Value *)local_50;
  this_00 = (pointer *)(local_50 + 0x10);
  do {
    this_00 = &(((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                ((long)this_00 + -0x18))->
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x261f67);
  } while ((Boxed_Value *)this_00 != __last._M_current);
  __first._M_current = (Boxed_Value *)this_00;
  Dynamic_Object::~Dynamic_Object(in_stack_fffffffffffffe90);
  std::__cxx11::string::~string((string *)(local_de + 0xe));
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe88);
  __gnu_cxx::
  __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
  ::__normal_iterator<chaiscript::Boxed_Value*>
            ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)in_stack_fffffffffffffe90,
             (__normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)in_stack_fffffffffffffe88);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe88);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe88);
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  insert<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,void>
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)this_00,
             __position,__first,__last);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x262029);
  iVar2 = (*peVar3->_vptr_Proxy_Function_Base[3])(peVar3,local_30,local_18);
  bVar1 = (byte)iVar2;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (in_stack_fffffffffffffea0);
  return (bool)(bVar1 & 1);
}

Assistant:

virtual bool call_match(const std::vector<Boxed_Value> &vals, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
          {
            std::vector<Boxed_Value> new_vals{Boxed_Value(Dynamic_Object(m_type_name))};
            new_vals.insert(new_vals.end(), vals.begin(), vals.end());

            return m_func->call_match(new_vals, t_conversions);
          }